

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O1

void __thiscall FString::MergeChars(FString *this,char *charset,char newchar)

{
  uint uVar1;
  char *pcVar2;
  long lVar3;
  char *pcVar4;
  char cVar5;
  ulong uVar6;
  size_t newlen;
  
  LockBuffer(this);
  uVar1 = *(uint *)(this->Chars + -0xc);
  if ((ulong)uVar1 == 0) {
    newlen = 0;
  }
  else {
    uVar6 = 0;
    newlen = 0;
    do {
      pcVar2 = this->Chars;
      cVar5 = pcVar2[uVar6];
      pcVar4 = strchr(charset,(int)cVar5);
      if (pcVar4 == (char *)0x0) {
        uVar6 = uVar6 + 1;
      }
      else {
        do {
          lVar3 = uVar6 + 1;
          uVar6 = uVar6 + 1;
          pcVar4 = strchr(charset,(int)pcVar2[lVar3]);
          cVar5 = newchar;
        } while (pcVar4 != (char *)0x0);
      }
      pcVar2[newlen] = cVar5;
      newlen = newlen + 1;
    } while (uVar6 < uVar1);
  }
  this->Chars[newlen] = '\0';
  ReallocBuffer(this,newlen);
  UnlockBuffer(this);
  return;
}

Assistant:

void FString::MergeChars (const char *charset, char newchar)
{
	size_t read, write, mylen;

	LockBuffer();
	for (read = write = 0, mylen = Len(); read < mylen; )
	{
		if (strchr (charset, Chars[read]) != NULL)
		{
			while (strchr (charset, Chars[++read]) != NULL)
			{
			}
			Chars[write++] = newchar;
		}
		else
		{
			Chars[write++] = Chars[read++];
		}
	}
	Chars[write] = '\0';
	ReallocBuffer (write);
	UnlockBuffer();
}